

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

Ptr __thiscall
core::image::double_to_byte_image(image *this,ConstPtr *image,double vmin,double vmax)

{
  bool bVar1;
  int iVar2;
  int height;
  int chans;
  invalid_argument *this_00;
  TypedImageBase<unsigned_char> *this_01;
  ImageBase *pIVar3;
  TypedImageBase<double> *this_02;
  element_type *this_03;
  double *pdVar4;
  element_type *this_04;
  uchar *puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double dVar6;
  double dVar7;
  Ptr PVar8;
  double value;
  int i;
  double local_28;
  double vmax_local;
  double vmin_local;
  ConstPtr *image_local;
  Ptr *img;
  
  local_28 = vmax;
  vmax_local = vmin;
  vmin_local = (double)image;
  image_local = (ConstPtr *)this;
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  Image<unsigned_char>::create();
  this_01 = &std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<unsigned_char>;
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar2 = ImageBase::width(pIVar3);
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  height = ImageBase::height(pIVar3);
  pIVar3 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  chans = ImageBase::channels(pIVar3);
  TypedImageBase<unsigned_char>::allocate(this_01,iVar2,height,chans);
  value._4_4_ = 0;
  while( true ) {
    this_02 = &std::
               __shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<double>;
    iVar2 = TypedImageBase<double>::get_value_amount(this_02);
    if (iVar2 <= value._4_4_) break;
    this_03 = std::
              __shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    pdVar4 = Image<double>::at(this_03,value._4_4_);
    pdVar4 = std::max<double>(&vmax_local,pdVar4);
    pdVar4 = std::min<double>(&local_28,pdVar4);
    dVar6 = *pdVar4 - vmax_local;
    dVar7 = local_28 - vmax_local;
    this_04 = std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    puVar5 = Image<unsigned_char>::at(this_04,value._4_4_);
    *puVar5 = (uchar)(int)((dVar6 * 255.0) / dVar7 + 0.5);
    value._4_4_ = value._4_4_ + 1;
  }
  PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar8.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ByteImage::Ptr
double_to_byte_image (DoubleImage::ConstPtr image, double vmin, double vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        double value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0 * (value - vmin) / (vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5);
    }
    return img;
}